

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameTableTest(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3 *db;
  u64 uVar1;
  sqlite3_xauth p_Var2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uchar *zDb;
  uchar *zSql;
  i64 iVar7;
  uchar *zWhen;
  i64 iVar8;
  uint uVar9;
  Parse sParse;
  NameContext local_68;
  
  db = context->pOut->db;
  zDb = sqlite3_value_text(*argv);
  zSql = sqlite3_value_text(argv[1]);
  iVar7 = sqlite3VdbeIntValue(argv[4]);
  uVar1 = db->flags;
  zWhen = sqlite3_value_text(argv[5]);
  iVar8 = sqlite3VdbeIntValue(argv[6]);
  p_Var2 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  if (zSql == (uchar *)0x0 || zDb == (uchar *)0x0) goto LAB_001bb530;
  uVar3 = db->flags;
  if ((int)iVar8 != 0) {
    db->flags = uVar3 & 0xffffffff9fffffff;
  }
  iVar5 = renameParseSql(&sParse,(char *)zDb,db,(char *)zSql,(int)iVar7);
  db->flags = db->flags | (ulong)((uint)uVar3 & 0x60000000);
  bVar4 = true;
  if (iVar5 == 0) {
    uVar9 = (uint)uVar1;
    if ((sParse.pNewTable != (Table *)0x0 && (uVar9 >> 0x1a & 1) == 0) &&
       ((sParse.pNewTable)->eTabType == '\x02')) {
      local_68.ncFlags = 0;
      local_68._44_4_ = 0;
      local_68.pWinSelect = (Select *)0x0;
      local_68.pNext = (NameContext *)0x0;
      local_68.nRef = 0;
      local_68.nNcErr = 0;
      local_68.pSrcList = (SrcList *)0x0;
      local_68.uNC.pEList = (ExprList *)0x0;
      local_68.pParse = &sParse;
      sqlite3SelectPrep(&sParse,((sParse.pNewTable)->u).view.pSelect,&local_68);
      bVar4 = sParse.rc != 0 && sParse.nErr != 0;
      goto LAB_001bb421;
    }
    if (sParse.pNewTrigger != (Trigger *)0x0) {
      if (((uVar9 >> 0x1a & 1) == 0) && (iVar5 = renameResolveTrigger(&sParse), iVar5 != 0))
      goto LAB_001bb421;
      iVar5 = sqlite3SchemaToIndex(db,(sParse.pNewTrigger)->pTabSchema);
      iVar6 = sqlite3FindDbName(db,(char *)zDb);
      if (iVar5 == iVar6) {
        sqlite3_result_int(context,1);
      }
    }
  }
  else {
LAB_001bb421:
    if (((bool)(zWhen != (uchar *)0x0 & bVar4)) && ((db->flags & 0x10000001) != 1)) {
      renameColumnParseError(context,(char *)zWhen,argv[2],argv[3],&sParse);
    }
  }
  renameParseCleanup(&sParse);
LAB_001bb530:
  db->xAuth = p_Var2;
  return;
}

Assistant:

static void renameTableTest(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char const *zDb = (const char*)sqlite3_value_text(argv[0]);
  char const *zInput = (const char*)sqlite3_value_text(argv[1]);
  int bTemp = sqlite3_value_int(argv[4]);
  int isLegacy = (db->flags & SQLITE_LegacyAlter);
  char const *zWhen = (const char*)sqlite3_value_text(argv[5]);
  int bNoDQS = sqlite3_value_int(argv[6]);

#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
  db->xAuth = 0;
#endif

  UNUSED_PARAMETER(NotUsed);

  if( zDb && zInput ){
    int rc;
    Parse sParse;
    int flags = db->flags;
    if( bNoDQS ) db->flags &= ~(SQLITE_DqsDML|SQLITE_DqsDDL);
    rc = renameParseSql(&sParse, zDb, db, zInput, bTemp);
    db->flags |= (flags & (SQLITE_DqsDML|SQLITE_DqsDDL));
    if( rc==SQLITE_OK ){
      if( isLegacy==0 && sParse.pNewTable && IsView(sParse.pNewTable) ){
        NameContext sNC;
        memset(&sNC, 0, sizeof(sNC));
        sNC.pParse = &sParse;
        sqlite3SelectPrep(&sParse, sParse.pNewTable->u.view.pSelect, &sNC);
        if( sParse.nErr ) rc = sParse.rc;
      }

      else if( sParse.pNewTrigger ){
        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse);
        }
        if( rc==SQLITE_OK ){
          int i1 = sqlite3SchemaToIndex(db, sParse.pNewTrigger->pTabSchema);
          int i2 = sqlite3FindDbName(db, zDb);
          if( i1==i2 ){
            /* Handle output case B */
            sqlite3_result_int(context, 1);
          }
        }
      }
    }

    if( rc!=SQLITE_OK && zWhen && !sqlite3WritableSchema(db) ){
      /* Output case A */
      renameColumnParseError(context, zWhen, argv[2], argv[3],&sParse);
    }
    renameParseCleanup(&sParse);
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
}